

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::MemoryStressCase::MemoryStressCase
          (MemoryStressCase *this,TestContext *ctx,RenderContext *renderContext,deUint32 objectTypes
          ,int minTextureSize,int maxTextureSize,int minBufferSize,int maxBufferSize,bool write,
          bool use,bool useDummyData,bool clearAfterOOM,char *name,char *desc)

{
  tcu::TestCase::TestCase(&this->super_TestCase,ctx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MemoryStressCase_01e6db60;
  this->m_iteration = 0;
  this->m_iterationCount = 5;
  (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_allocated).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->m_objectTypes = objectTypes;
  this->m_zeroAlloc = false;
  this->m_clearAfterOOM = clearAfterOOM;
  this->m_renderCtx = renderContext;
  std::vector<int,_std::allocator<int>_>::reserve(&this->m_allocated,5);
  (this->m_config).maxTextureSize = maxTextureSize;
  (this->m_config).minTextureSize = minTextureSize;
  (this->m_config).maxBufferSize = maxBufferSize;
  (this->m_config).minBufferSize = minBufferSize;
  (this->m_config).useDummyData = useDummyData;
  (this->m_config).write = write;
  (this->m_config).use = use;
  return;
}

Assistant:

MemoryStressCase::MemoryStressCase (tcu::TestContext& ctx, glu::RenderContext& renderContext, deUint32 objectTypes, int minTextureSize, int maxTextureSize, int minBufferSize, int maxBufferSize, bool write, bool use, bool useDummyData, bool clearAfterOOM, const char* name, const char* desc)
	: tcu::TestCase					(ctx, name, desc)
	, m_iteration					(0)
	, m_iterationCount				(5)
	, m_objectTypes					((MemObjectType)objectTypes)
	, m_zeroAlloc					(false)
	, m_clearAfterOOM				(clearAfterOOM)
	, m_renderCtx					(renderContext)
{
	m_allocated.reserve(m_iterationCount);
	m_config.maxTextureSize = maxTextureSize;
	m_config.minTextureSize = minTextureSize;
	m_config.maxBufferSize	= maxBufferSize;
	m_config.minBufferSize	= minBufferSize;
	m_config.useDummyData	= useDummyData;
	m_config.write			= write;
	m_config.use			= use;
}